

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

_Bool upb_Arena_IsFused(upb_Arena *a,upb_Arena *b)

{
  upb_ArenaInternal *ai;
  upb_ArenaRoot uVar1;
  upb_ArenaInternal *local_68;
  upb_ArenaInternal *tmp;
  upb_ArenaInternal *local_40;
  upb_ArenaInternal *rb;
  upb_ArenaInternal *local_28;
  upb_ArenaInternal *ra;
  upb_Arena *b_local;
  upb_Arena *a_local;
  
  if (a != b) {
    ai = upb_Arena_Internal(a);
    uVar1 = _upb_Arena_FindRoot(ai);
    rb = uVar1.root;
    local_28 = rb;
    local_40 = upb_Arena_Internal(b);
    while( true ) {
      uVar1 = _upb_Arena_FindRoot(local_40);
      tmp = uVar1.root;
      local_40 = tmp;
      if (local_28 == tmp) break;
      uVar1 = _upb_Arena_FindRoot(local_28);
      local_68 = uVar1.root;
      if (local_28 == local_68) {
        return false;
      }
      local_28 = local_68;
    }
  }
  return true;
}

Assistant:

bool upb_Arena_IsFused(const upb_Arena* a, const upb_Arena* b) {
  if (a == b) return true;  // trivial fuse
  upb_ArenaInternal* ra = _upb_Arena_FindRoot(upb_Arena_Internal(a)).root;
  upb_ArenaInternal* rb = upb_Arena_Internal(b);
  while (true) {
    rb = _upb_Arena_FindRoot(rb).root;
    if (ra == rb) return true;
    upb_ArenaInternal* tmp = _upb_Arena_FindRoot(ra).root;
    if (ra == tmp) return false;
    // a's root changed since we last checked.  Retry.
    ra = tmp;
  }
}